

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_popup_begin(nk_context *ctx,nk_popup_type type,char *title,nk_flags flags,nk_rect rect)

{
  undefined8 uVar1;
  nk_context *ctx_00;
  nk_key nVar2;
  nk_size nVar3;
  nk_handle nVar4;
  nk_key nVar5;
  nk_key nVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  nk_hash nVar12;
  int iVar13;
  nk_window *ptr;
  nk_panel *pnVar14;
  nk_key *pnVar15;
  nk_window *win;
  nk_rect r;
  float local_58;
  float fStack_54;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x5047,
                  "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
                 );
  }
  if (title == (char *)0x0) {
    __assert_fail("title",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x5048,
                  "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
                 );
  }
  ctx_00 = (nk_context *)ctx->current;
  if (ctx_00 == (nk_context *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x5049,
                  "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
                 );
  }
  nVar2 = (ctx_00->input).keyboard.keys[0x15];
  if (nVar2 != (nk_key)0x0) {
    if ((*(byte *)nVar2 & 0xf4) != 0) {
      __assert_fail("!(panel->type & NK_PANEL_SET_POPUP) && \"popups are not allowed to have popups\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x5050,
                    "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
                   );
    }
    uVar11 = nk_strlen(title);
    win = (nk_window *)(ulong)uVar11;
    nVar12 = nk_murmur_hash(title,uVar11,4);
    ptr = *(nk_window **)&(ctx_00->input).mouse.buttons[1].clicked;
    if (ptr == (nk_window *)0x0) {
      ptr = (nk_window *)nk_create_window(ctx);
      ptr->parent = (nk_window *)ctx_00;
      *(nk_window **)&(ctx_00->input).mouse.buttons[1].clicked = ptr;
      (ctx_00->input).mouse.buttons[2].clicked = 0;
      (ctx_00->input).mouse.buttons[1].clicked_pos.y = 5.60519e-45;
    }
    if ((ctx_00->input).mouse.buttons[2].down != nVar12) {
      if ((ctx_00->input).mouse.buttons[2].clicked != 0) {
        return 0;
      }
      win = (nk_window *)0x1a8;
      nk_zero(ptr,0x1a8);
      (ctx_00->input).mouse.buttons[2].down = nVar12;
      (ctx_00->input).mouse.buttons[2].clicked = 1;
      (ctx_00->input).mouse.buttons[1].clicked_pos.y = 5.60519e-45;
    }
    pnVar15 = (ctx_00->input).keyboard.keys + 0x15;
    ctx->current = ptr;
    uVar1 = *(undefined8 *)((long)(ctx_00->input).keyboard.keys[0x15] + 0x44);
    local_58 = rect.x;
    fStack_54 = rect.y;
    ptr->parent = (nk_window *)ctx_00;
    (ptr->bounds).x = (float)uVar1 + local_58;
    (ptr->bounds).y = (float)((ulong)uVar1 >> 0x20) + fStack_54;
    (ptr->bounds).w = rect.w;
    (ptr->bounds).h = rect.h;
    ptr->seq = ctx->seq;
    pnVar14 = (nk_panel *)nk_create_panel(ctx);
    ptr->layout = pnVar14;
    ptr->flags = (uint)(type == NK_POPUP_DYNAMIC) << 10 | flags | 1;
    iVar13 = (ctx_00->input).keyboard.keys[0xe].down;
    uVar11 = (ctx_00->input).keyboard.keys[0xe].clicked;
    iVar7 = (ctx_00->input).keyboard.keys[0xf].down;
    uVar8 = (ctx_00->input).keyboard.keys[0xf].clicked;
    iVar9 = (ctx_00->input).keyboard.keys[0x10].down;
    uVar10 = (ctx_00->input).keyboard.keys[0x10].clicked;
    nVar4 = *(nk_handle *)((ctx_00->input).keyboard.keys + 0x11);
    nVar2 = (ctx_00->input).keyboard.keys[0x12];
    nVar5 = (ctx_00->input).keyboard.keys[0x13];
    nVar6 = (ctx_00->input).keyboard.keys[0x14];
    (ptr->buffer).base = (nk_buffer *)(ctx_00->input).keyboard.keys[0xd];
    (ptr->buffer).clip.x = (float)iVar13;
    (ptr->buffer).clip.y = (float)uVar11;
    (ptr->buffer).clip.w = (float)iVar7;
    (ptr->buffer).clip.h = (float)uVar8;
    (ptr->buffer).use_clipping = iVar9;
    *(uint *)&(ptr->buffer).field_0x1c = uVar10;
    (ptr->buffer).userdata = nVar4;
    (ptr->buffer).begin = (nk_size)nVar2;
    (ptr->buffer).end = (nk_size)nVar5;
    (ptr->buffer).last = (nk_size)nVar6;
    nk_start_popup(ctx_00,win);
    nVar3 = (ctx->memory).allocated;
    r.w = 16384.0;
    r.h = 16384.0;
    r.x = -8192.0;
    r.y = -8192.0;
    nk_push_scissor(&ptr->buffer,r);
    iVar13 = nk_panel_begin(ctx,title,NK_PANEL_POPUP);
    if (iVar13 == 0) {
      while (nVar2 = *pnVar15, nVar2 != (nk_key)0x0) {
        *(byte *)((long)nVar2 + 5) = *(byte *)((long)nVar2 + 5) | 0x80;
        pnVar15 = (nk_key *)((long)nVar2 + 0x198);
      }
      *(undefined4 *)((long)(ctx_00->input).keyboard.keys[0x15] + 0x188) = 0;
      (ctx_00->input).mouse.buttons[2].clicked = 0;
      (ctx->memory).allocated = nVar3;
      ctx->current = (nk_window *)ctx_00;
      nk_free_page_element(ctx,(nk_page_element *)ptr->layout);
      ptr->layout = (nk_panel *)0x0;
      iVar13 = 0;
    }
    else {
      while (nVar2 = *pnVar15, nVar2 != (nk_key)0x0) {
        *(uint *)((long)nVar2 + 4) = *(uint *)((long)nVar2 + 4) & 0xffff77ff | 0x800;
        pnVar15 = (nk_key *)((long)nVar2 + 0x198);
      }
      (ctx_00->input).mouse.buttons[2].clicked = 1;
      pnVar14 = ptr->layout;
      pnVar14->offset_x = &(ptr->scrollbar).x;
      pnVar14->offset_y = &(ptr->scrollbar).y;
      pnVar14->parent = (nk_panel *)(ctx_00->input).keyboard.keys[0x15];
      iVar13 = 1;
    }
    return iVar13;
  }
  __assert_fail("ctx->current->layout",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x504a,
                "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
               );
}

Assistant:

NK_API int
nk_popup_begin(struct nk_context *ctx, enum nk_popup_type type,
    const char *title, nk_flags flags, struct nk_rect rect)
{
    struct nk_window *popup;
    struct nk_window *win;
    struct nk_panel *panel;

    int title_len;
    nk_hash title_hash;
    nk_size allocated;

    NK_ASSERT(ctx);
    NK_ASSERT(title);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    panel = win->layout;
    NK_ASSERT(!(panel->type & NK_PANEL_SET_POPUP) && "popups are not allowed to have popups");
    title_len = (int)nk_strlen(title);
    title_hash = nk_murmur_hash(title, (int)title_len, NK_PANEL_POPUP);

    popup = win->popup.win;
    if (!popup) {
        popup = (struct nk_window*)nk_create_window(ctx);
        popup->parent = win;
        win->popup.win = popup;
        win->popup.active = 0;
        win->popup.type = NK_PANEL_POPUP;
    }

    /* make sure we have to correct popup */
    if (win->popup.name != title_hash) {
        if (!win->popup.active) {
            nk_zero(popup, sizeof(*popup));
            win->popup.name = title_hash;
            win->popup.active = 1;
            win->popup.type = NK_PANEL_POPUP;
        } else return 0;
    }

    /* popup position is local to window */
    ctx->current = popup;
    rect.x += win->layout->clip.x;
    rect.y += win->layout->clip.y;

    /* setup popup data */
    popup->parent = win;
    popup->bounds = rect;
    popup->seq = ctx->seq;
    popup->layout = (struct nk_panel*)nk_create_panel(ctx);
    popup->flags = flags;
    popup->flags |= NK_WINDOW_BORDER;
    if (type == NK_POPUP_DYNAMIC)
        popup->flags |= NK_WINDOW_DYNAMIC;

    popup->buffer = win->buffer;
    nk_start_popup(ctx, win);
    allocated = ctx->memory.allocated;
    nk_push_scissor(&popup->buffer, nk_null_rect);

    if (nk_panel_begin(ctx, title, NK_PANEL_POPUP)) {
        /* popup is running therefore invalidate parent panels */
        struct nk_panel *root;
        root = win->layout;
        while (root) {
            root->flags |= NK_WINDOW_ROM;
            root->flags &= ~(nk_flags)NK_WINDOW_REMOVE_ROM;
            root = root->parent;
        }
        win->popup.active = 1;
        popup->layout->offset_x = &popup->scrollbar.x;
        popup->layout->offset_y = &popup->scrollbar.y;
        popup->layout->parent = win->layout;
        return 1;
    } else {
        /* popup was closed/is invalid so cleanup */
        struct nk_panel *root;
        root = win->layout;
        while (root) {
            root->flags |= NK_WINDOW_REMOVE_ROM;
            root = root->parent;
        }
        win->layout->popup_buffer.active = 0;
        win->popup.active = 0;
        ctx->memory.allocated = allocated;
        ctx->current = win;
        nk_free_panel(ctx, popup->layout);
        popup->layout = 0;
        return 0;
    }
}